

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void sycc422_to_rgb(opj_image_t *img)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  opj_image_comp_t *poVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int *piVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int *piVar22;
  uint *puVar23;
  uint *puVar24;
  uint uVar25;
  long lVar26;
  uint *puVar27;
  int *piVar28;
  float fVar29;
  
  poVar6 = img->comps;
  bVar1 = (byte)poVar6->prec;
  iVar17 = 1 << (bVar1 - 1 & 0x1f);
  uVar15 = poVar6->w;
  uVar12 = (ulong)poVar6->h;
  piVar16 = poVar6->data;
  piVar22 = poVar6[1].data;
  piVar28 = poVar6[2].data;
  lVar26 = uVar15 * uVar12 * 4;
  puVar7 = (uint *)opj_image_data_alloc(lVar26);
  puVar8 = (uint *)opj_image_data_alloc(lVar26);
  puVar9 = (uint *)opj_image_data_alloc(lVar26);
  if (puVar9 != (uint *)0x0 && (puVar8 != (uint *)0x0 && puVar7 != (uint *)0x0)) {
    if (uVar12 != 0) {
      uVar25 = ~(-1 << (bVar1 & 0x1f));
      fVar29 = (float)-iVar17;
      uVar14 = img->x0 & 1;
      uVar20 = (ulong)uVar15 - (ulong)uVar14;
      uVar21 = uVar20 & 0xfffffffffffffffe;
      uVar10 = 0;
      puVar23 = puVar7;
      puVar24 = puVar8;
      puVar27 = puVar9;
      do {
        if (uVar14 != 0) {
          iVar2 = *piVar16;
          uVar11 = (int)(fVar29 * 1.402) + iVar2;
          uVar15 = uVar25;
          if ((int)uVar11 < (int)uVar25) {
            uVar15 = uVar11;
          }
          if ((int)uVar11 < 0) {
            uVar15 = 0;
          }
          *puVar23 = uVar15;
          uVar11 = iVar2 - (int)(fVar29 * 0.344 + fVar29 * 0.714);
          uVar15 = uVar25;
          if ((int)uVar11 < (int)uVar25) {
            uVar15 = uVar11;
          }
          if ((int)uVar11 < 0) {
            uVar15 = 0;
          }
          *puVar24 = uVar15;
          uVar11 = iVar2 + (int)(fVar29 * 1.772);
          uVar15 = uVar25;
          if ((int)uVar11 < (int)uVar25) {
            uVar15 = uVar11;
          }
          if ((int)uVar11 < 0) {
            uVar15 = 0;
          }
          *puVar27 = uVar15;
          piVar16 = piVar16 + 1;
          puVar23 = puVar23 + 1;
          puVar24 = puVar24 + 1;
          puVar27 = puVar27 + 1;
        }
        if (uVar21 == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          do {
            iVar2 = *piVar28;
            iVar3 = *piVar16;
            uVar11 = (int)((double)(iVar2 - iVar17) * 1.402) + iVar3;
            uVar15 = uVar11;
            if ((int)uVar25 <= (int)uVar11) {
              uVar15 = uVar25;
            }
            uVar18 = 0;
            if (-1 < (int)uVar11) {
              uVar18 = uVar15;
            }
            iVar4 = *piVar22;
            *puVar23 = uVar18;
            uVar11 = iVar3 - (int)((double)(iVar4 - iVar17) * 0.344 +
                                  (double)(iVar2 - iVar17) * 0.714);
            uVar15 = uVar11;
            if ((int)uVar25 <= (int)uVar11) {
              uVar15 = uVar25;
            }
            uVar18 = 0;
            if (-1 < (int)uVar11) {
              uVar18 = uVar15;
            }
            *puVar24 = uVar18;
            uVar11 = iVar3 + (int)((double)(iVar4 - iVar17) * 1.772);
            uVar15 = uVar11;
            if ((int)uVar25 <= (int)uVar11) {
              uVar15 = uVar25;
            }
            uVar18 = 0;
            if (-1 < (int)uVar11) {
              uVar18 = uVar15;
            }
            *puVar27 = uVar18;
            iVar2 = piVar16[1];
            iVar3 = *piVar28;
            iVar4 = *piVar22;
            uVar11 = (int)((double)(iVar3 - iVar17) * 1.402) + iVar2;
            uVar15 = uVar11;
            if ((int)uVar25 <= (int)uVar11) {
              uVar15 = uVar25;
            }
            uVar18 = 0;
            if (-1 < (int)uVar11) {
              uVar18 = uVar15;
            }
            puVar23[1] = uVar18;
            uVar11 = iVar2 - (int)((double)(iVar4 - iVar17) * 0.344 +
                                  (double)(iVar3 - iVar17) * 0.714);
            uVar15 = uVar11;
            if ((int)uVar25 <= (int)uVar11) {
              uVar15 = uVar25;
            }
            uVar18 = 0;
            if (-1 < (int)uVar11) {
              uVar18 = uVar15;
            }
            puVar24[1] = uVar18;
            uVar11 = iVar2 + (int)((double)(iVar4 - iVar17) * 1.772);
            uVar15 = uVar11;
            if ((int)uVar25 <= (int)uVar11) {
              uVar15 = uVar25;
            }
            uVar18 = 0;
            if (-1 < (int)uVar11) {
              uVar18 = uVar15;
            }
            puVar27[1] = uVar18;
            piVar16 = piVar16 + 2;
            puVar23 = puVar23 + 2;
            puVar24 = puVar24 + 2;
            puVar27 = puVar27 + 2;
            piVar22 = piVar22 + 1;
            piVar28 = piVar28 + 1;
            uVar13 = uVar13 + 2;
          } while (uVar13 < uVar21);
        }
        if (uVar13 < uVar20) {
          iVar2 = *piVar16;
          uVar11 = (int)((double)(*piVar28 - iVar17) * 1.402) + iVar2;
          uVar15 = uVar25;
          if ((int)uVar11 < (int)uVar25) {
            uVar15 = uVar11;
          }
          if ((int)uVar11 < 0) {
            uVar15 = 0;
          }
          uVar18 = iVar2 - (int)((double)(*piVar22 - iVar17) * 0.344 +
                                (double)(*piVar28 - iVar17) * 0.714);
          uVar11 = uVar25;
          if ((int)uVar18 < (int)uVar25) {
            uVar11 = uVar18;
          }
          if ((int)uVar18 < 0) {
            uVar11 = 0;
          }
          uVar19 = (int)((double)(*piVar22 - iVar17) * 1.772) + iVar2;
          uVar18 = uVar25;
          if ((int)uVar19 < (int)uVar25) {
            uVar18 = uVar19;
          }
          *puVar23 = uVar15;
          if ((int)uVar19 < 0) {
            uVar18 = 0;
          }
          *puVar24 = uVar11;
          *puVar27 = uVar18;
          piVar16 = piVar16 + 1;
          puVar23 = puVar23 + 1;
          puVar24 = puVar24 + 1;
          puVar27 = puVar27 + 1;
          piVar22 = piVar22 + 1;
          piVar28 = piVar28 + 1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar12);
    }
    opj_image_data_free(img->comps->data);
    poVar6 = img->comps;
    poVar6->data = (OPJ_INT32 *)puVar7;
    opj_image_data_free(poVar6[1].data);
    poVar6 = img->comps;
    poVar6[1].data = (OPJ_INT32 *)puVar8;
    opj_image_data_free(poVar6[2].data);
    poVar6 = img->comps;
    poVar6[2].data = (OPJ_INT32 *)puVar9;
    poVar6[2].w = poVar6->w;
    poVar6[1].w = poVar6->w;
    poVar6[2].h = poVar6->h;
    poVar6[1].h = poVar6->h;
    OVar5 = poVar6->dy;
    poVar6[2].dx = poVar6->dx;
    poVar6[1].dx = poVar6->dx;
    poVar6[2].dy = OVar5;
    poVar6[1].dy = OVar5;
    img->color_space = OPJ_CLRSPC_SRGB;
    return;
  }
  opj_image_data_free();
  opj_image_data_free(puVar8);
  opj_image_data_free(puVar9);
  return;
}

Assistant:

static void sycc422_to_rgb(opj_image_t *img)
{
    int *d0, *d1, *d2, *r, *g, *b;
    const int *y, *cb, *cr;
    size_t maxw, maxh, max, offx, loopmaxw;
    int offset, upb;
    size_t i;

    upb = (int)img->comps[0].prec;
    offset = 1 << (upb - 1);
    upb = (1 << upb) - 1;

    maxw = (size_t)img->comps[0].w;
    maxh = (size_t)img->comps[0].h;
    max = maxw * maxh;

    y = img->comps[0].data;
    cb = img->comps[1].data;
    cr = img->comps[2].data;

    d0 = r = (int*)opj_image_data_alloc(sizeof(int) * max);
    d1 = g = (int*)opj_image_data_alloc(sizeof(int) * max);
    d2 = b = (int*)opj_image_data_alloc(sizeof(int) * max);

    if (r == NULL || g == NULL || b == NULL) {
        goto fails;
    }

    /* if img->x0 is odd, then first column shall use Cb/Cr = 0 */
    offx = img->x0 & 1U;
    loopmaxw = maxw - offx;

    for (i = 0U; i < maxh; ++i) {
        size_t j;

        if (offx > 0U) {
            sycc_to_rgb(offset, upb, *y, 0, 0, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
        }

        for (j = 0U; j < (loopmaxw & ~(size_t)1U); j += 2U) {
            sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
            sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
            ++cb;
            ++cr;
        }
        if (j < loopmaxw) {
            sycc_to_rgb(offset, upb, *y, *cb, *cr, r, g, b);
            ++y;
            ++r;
            ++g;
            ++b;
            ++cb;
            ++cr;
        }
    }

    opj_image_data_free(img->comps[0].data);
    img->comps[0].data = d0;
    opj_image_data_free(img->comps[1].data);
    img->comps[1].data = d1;
    opj_image_data_free(img->comps[2].data);
    img->comps[2].data = d2;

    img->comps[1].w = img->comps[2].w = img->comps[0].w;
    img->comps[1].h = img->comps[2].h = img->comps[0].h;
    img->comps[1].dx = img->comps[2].dx = img->comps[0].dx;
    img->comps[1].dy = img->comps[2].dy = img->comps[0].dy;
    img->color_space = OPJ_CLRSPC_SRGB;
    return;

fails:
    opj_image_data_free(r);
    opj_image_data_free(g);
    opj_image_data_free(b);
}